

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_sound.cpp
# Opt level: O0

void Cmd_snd_reset(FCommandLine *argv,APlayerPawn *who,int key)

{
  int key_local;
  APlayerPawn *who_local;
  FCommandLine *argv_local;
  
  I_ShutdownMusic(false);
  S_EvictAllChannels();
  I_CloseSound();
  I_InitSound();
  S_RestartMusic();
  S_RestoreEvictedChannels();
  return;
}

Assistant:

CCMD (snd_reset)
{
	I_ShutdownMusic();
	S_EvictAllChannels();
	I_CloseSound();
	I_InitSound();
	S_RestartMusic();
	S_RestoreEvictedChannels();
}